

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumber
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  bool bVar1;
  EnumValueDescriptor *this_00;
  reference ppEVar2;
  FileDescriptorTables *local_70;
  iterator local_58;
  pair<const_void_*,_int> local_48;
  undefined1 local_38 [8];
  const_iterator it;
  int base;
  int number_local;
  EnumDescriptor *parent_local;
  FileDescriptorTables *this_local;
  
  it.inner_.field_1._4_4_ = number;
  _base = parent;
  parent_local = (EnumDescriptor *)this;
  this_00 = EnumDescriptor::value(parent,0);
  it.inner_.field_1._0_4_ = EnumValueDescriptor::number(this_00);
  if (((int)it.inner_.field_1._4_4_ < (int)it.inner_.field_1._0_4_) ||
     ((long)(int)it.inner_.field_1._0_4_ + (long)_base->sequential_value_limit_ <
      (long)(int)it.inner_.field_1._4_4_)) {
    std::pair<const_void_*,_int>::pair<const_google::protobuf::EnumDescriptor_*&,_int_&,_true>
              (&local_48,(EnumDescriptor **)&base,(int *)((long)&it.inner_.field_1 + 4));
    _local_38 = (iterator)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                          (&(this->enum_values_by_number_).
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                           ,(key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *)
                            &local_48);
    local_58 = (iterator)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ::end(&(this->enum_values_by_number_).
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    );
    bVar1 = absl::lts_20250127::container_internal::operator==
                      ((const_iterator *)local_38,(const_iterator *)&local_58);
    if (bVar1) {
      local_70 = (FileDescriptorTables *)0x0;
    }
    else {
      ppEVar2 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::const_iterator::operator*((const_iterator *)local_38);
      local_70 = (FileDescriptorTables *)*ppEVar2;
    }
    this_local = local_70;
  }
  else {
    this_local = (FileDescriptorTables *)
                 EnumDescriptor::value(_base,it.inner_.field_1._4_4_ - it.inner_.field_1._0_4_);
  }
  return (EnumValueDescriptor *)this_local;
}

Assistant:

inline const EnumValueDescriptor* FileDescriptorTables::FindEnumValueByNumber(
    const EnumDescriptor* parent, int number) const {
  // If `number` is within the sequential range, just index into the parent
  // without doing a table lookup.
  const int base = parent->value(0)->number();
  if (base <= number &&
      number <= static_cast<int64_t>(base) + parent->sequential_value_limit_) {
    return parent->value(number - base);
  }

  auto it = enum_values_by_number_.find(ParentNumberQuery{{parent, number}});
  return it == enum_values_by_number_.end() ? nullptr : *it;
}